

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t find_cab_magic(char *p)

{
  byte bVar1;
  
  bVar1 = p[4];
  if (bVar1 < 0x46) {
    if (bVar1 == 0) {
      return (uint)(*(long *)p != 0x4643534d) * 5;
    }
    if (bVar1 == 0x43) {
      return L'\x02';
    }
  }
  else {
    if (bVar1 == 0x46) {
      return L'\x01';
    }
    if (bVar1 == 0x4d) {
      return L'\x04';
    }
    if (bVar1 == 0x53) {
      return L'\x03';
    }
  }
  return L'\x05';
}

Assistant:

static int
find_cab_magic(const char *p)
{
	switch (p[4]) {
	case 0:
		/*
		 * Note: Self-Extraction program has 'MSCF' string in their
		 * program. If we were finding 'MSCF' string only, we got
		 * wrong place for Cabinet header, thus, we have to check
		 * following four bytes which are reserved and must be set
		 * to zero.
		 */
		if (memcmp(p, "MSCF\0\0\0\0", 8) == 0)
			return 0;
		return 5;
	case 'F': return 1;
	case 'C': return 2;
	case 'S': return 3;
	case 'M': return 4;
	default:  return 5;
	}
}